

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_avx2_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i x;
  __m256i x_00;
  __m256i x_01;
  __m256i x_02;
  __m256i x_03;
  __m256i x_04;
  __m256i x_05;
  __m256i x_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint64_t uVar26;
  uint32_t *in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  __m256i popcnt_h;
  __m256i popcnt_d;
  __m256i popcnt_g;
  __m256i popcnt_c;
  __m256i popcnt_f;
  __m256i popcnt_b;
  __m256i popcnt_e;
  __m256i popcnt_a;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i r3;
  __m256i r2;
  __m256i r1;
  __m256i r0;
  uint8_t *end;
  __m256i counter8bit_h;
  __m256i counter8bit_g;
  __m256i counter8bit_f;
  __m256i counter8bit_e;
  __m256i counter8bit_d;
  __m256i counter8bit_c;
  __m256i counter8bit_b;
  __m256i counter8bit_a;
  int local;
  __m256i lo_nibble;
  __m256i popcnt_4bit;
  __m256i counter_h;
  __m256i counter_g;
  __m256i counter_f;
  __m256i counter_e;
  __m256i counter_d;
  __m256i counter_c;
  __m256i counter_b;
  __m256i counter_a;
  __m256i zero;
  undefined8 in_stack_ffffffffffffeb40;
  undefined8 in_stack_ffffffffffffeb48;
  longlong in_stack_ffffffffffffeb50;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined8 in_stack_ffffffffffffeb80;
  undefined8 in_stack_ffffffffffffeb88;
  longlong in_stack_ffffffffffffeb90;
  undefined8 in_stack_ffffffffffffeb98;
  undefined8 in_stack_ffffffffffffeba0;
  undefined8 in_stack_ffffffffffffeba8;
  longlong in_stack_ffffffffffffebb0;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  int local_10c4;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  uint8_t *local_f50;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_fa0 = ZEXT1632(ZEXT816(0));
  local_fc0 = ZEXT1632(ZEXT816(0));
  local_fe0 = ZEXT1632(ZEXT816(0));
  local_1000 = ZEXT1632(ZEXT816(0));
  local_1020 = ZEXT1632(ZEXT816(0));
  local_1040 = ZEXT1632(ZEXT816(0));
  local_1060 = ZEXT1632(ZEXT816(0));
  local_1080 = ZEXT1632(ZEXT816(0));
  uVar45 = 2;
  uVar46 = 1;
  uVar47 = 1;
  uVar48 = 0;
  uVar49 = 4;
  uVar50 = 3;
  uVar51 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,2,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,2,5);
  auVar1 = vpinsrb_avx(auVar1,2,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,2,9);
  auVar1 = vpinsrb_avx(auVar1,2,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,2,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  auVar1 = vpinsrb_avx(auVar1,4,0xf);
  auVar40 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar40 = vpinsrb_avx(auVar40,1,2);
  auVar40 = vpinsrb_avx(auVar40,2,3);
  auVar40 = vpinsrb_avx(auVar40,1,4);
  auVar40 = vpinsrb_avx(auVar40,2,5);
  auVar40 = vpinsrb_avx(auVar40,2,6);
  auVar40 = vpinsrb_avx(auVar40,3,7);
  auVar40 = vpinsrb_avx(auVar40,1,8);
  auVar40 = vpinsrb_avx(auVar40,2,9);
  auVar40 = vpinsrb_avx(auVar40,2,10);
  auVar40 = vpinsrb_avx(auVar40,3,0xb);
  auVar40 = vpinsrb_avx(auVar40,2,0xc);
  auVar40 = vpinsrb_avx(auVar40,3,0xd);
  auVar40 = vpinsrb_avx(auVar40,3,0xe);
  auVar40 = vpinsrb_avx(auVar40,4,0xf);
  uStack_d0 = auVar40._0_8_;
  uStack_c8 = auVar40._8_8_;
  uVar52 = 0xf;
  auVar40 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar40 = vpinsrb_avx(auVar40,0xf,2);
  auVar40 = vpinsrb_avx(auVar40,0xf,3);
  auVar40 = vpinsrb_avx(auVar40,0xf,4);
  auVar40 = vpinsrb_avx(auVar40,0xf,5);
  auVar40 = vpinsrb_avx(auVar40,0xf,6);
  auVar40 = vpinsrb_avx(auVar40,0xf,7);
  auVar40 = vpinsrb_avx(auVar40,0xf,8);
  auVar40 = vpinsrb_avx(auVar40,0xf,9);
  auVar40 = vpinsrb_avx(auVar40,0xf,10);
  auVar40 = vpinsrb_avx(auVar40,0xf,0xb);
  auVar40 = vpinsrb_avx(auVar40,0xf,0xc);
  auVar40 = vpinsrb_avx(auVar40,0xf,0xd);
  auVar40 = vpinsrb_avx(auVar40,0xf,0xe);
  auVar40 = vpinsrb_avx(auVar40,0xf,0xf);
  auVar31 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar31 = vpinsrb_avx(auVar31,0xf,2);
  auVar31 = vpinsrb_avx(auVar31,0xf,3);
  auVar31 = vpinsrb_avx(auVar31,0xf,4);
  auVar31 = vpinsrb_avx(auVar31,0xf,5);
  auVar31 = vpinsrb_avx(auVar31,0xf,6);
  auVar31 = vpinsrb_avx(auVar31,0xf,7);
  auVar31 = vpinsrb_avx(auVar31,0xf,8);
  auVar31 = vpinsrb_avx(auVar31,0xf,9);
  auVar31 = vpinsrb_avx(auVar31,0xf,10);
  auVar31 = vpinsrb_avx(auVar31,0xf,0xb);
  auVar31 = vpinsrb_avx(auVar31,0xf,0xc);
  auVar31 = vpinsrb_avx(auVar31,0xf,0xd);
  auVar31 = vpinsrb_avx(auVar31,0xf,0xe);
  auVar31 = vpinsrb_avx(auVar31,0xf,0xf);
  auVar31 = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar31;
  auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
  local_10c4 = 0;
  local_1100._0_16_ = ZEXT816(0);
  local_1100 = ZEXT1632(local_1100._0_16_);
  local_1120._0_16_ = ZEXT816(0);
  local_1120 = ZEXT1632(local_1120._0_16_);
  local_1140._0_16_ = ZEXT816(0);
  local_1140 = ZEXT1632(local_1140._0_16_);
  local_1160._0_16_ = ZEXT816(0);
  local_1160 = ZEXT1632(local_1160._0_16_);
  local_1180._0_16_ = ZEXT816(0);
  local_1180 = ZEXT1632(local_1180._0_16_);
  local_11a0._0_16_ = ZEXT816(0);
  local_11a0 = ZEXT1632(local_11a0._0_16_);
  local_11c0._0_16_ = ZEXT816(0);
  local_11c0 = ZEXT1632(local_11c0._0_16_);
  local_11e0._0_16_ = ZEXT816(0);
  local_11e0 = ZEXT1632(local_11e0._0_16_);
  for (local_f50 = in_RDI; uStack_10a8 = auVar40._8_8_, uStack_10b0 = auVar40._0_8_,
      local_f50 != in_RDI + (in_RSI & 0xffffffffffffff80); local_f50 = local_f50 + 0x80) {
    uVar28 = *(undefined8 *)local_f50;
    uVar33 = *(undefined8 *)(local_f50 + 8);
    uVar37 = *(undefined8 *)(local_f50 + 0x10);
    uVar42 = *(undefined8 *)(local_f50 + 0x18);
    a[1] = in_stack_ffffffffffffeba0;
    a[0] = in_stack_ffffffffffffeb98;
    a[2] = in_stack_ffffffffffffeba8;
    a[3] = in_stack_ffffffffffffebb0;
    b[0]._1_1_ = uVar46;
    b[0]._0_1_ = uVar45;
    b[0]._2_1_ = uVar47;
    b[0]._3_1_ = uVar48;
    b[0]._4_1_ = uVar49;
    b[0]._5_1_ = uVar50;
    b[0]._6_1_ = uVar51;
    b[0]._7_1_ = uVar52;
    b[1] = in_stack_ffffffffffffeb80;
    b[2] = in_stack_ffffffffffffeb88;
    b[3] = in_stack_ffffffffffffeb90;
    uVar27 = uVar28;
    uVar32 = uVar33;
    uVar36 = uVar37;
    uVar41 = uVar42;
    avx2_merge1_even(a,b);
    a_00[1] = in_stack_ffffffffffffeba0;
    a_00[0] = in_stack_ffffffffffffeb98;
    a_00[2] = in_stack_ffffffffffffeba8;
    a_00[3] = in_stack_ffffffffffffebb0;
    b_00[0]._1_1_ = uVar46;
    b_00[0]._0_1_ = uVar45;
    b_00[0]._2_1_ = uVar47;
    b_00[0]._3_1_ = uVar48;
    b_00[0]._4_1_ = uVar49;
    b_00[0]._5_1_ = uVar50;
    b_00[0]._6_1_ = uVar51;
    b_00[0]._7_1_ = uVar52;
    b_00[1] = in_stack_ffffffffffffeb80;
    b_00[2] = in_stack_ffffffffffffeb88;
    b_00[3] = in_stack_ffffffffffffeb90;
    avx2_merge1_odd(a_00,b_00);
    a_01[1] = in_stack_ffffffffffffeba0;
    a_01[0] = in_stack_ffffffffffffeb98;
    a_01[2] = in_stack_ffffffffffffeba8;
    a_01[3] = in_stack_ffffffffffffebb0;
    b_01[0]._1_1_ = uVar46;
    b_01[0]._0_1_ = uVar45;
    b_01[0]._2_1_ = uVar47;
    b_01[0]._3_1_ = uVar48;
    b_01[0]._4_1_ = uVar49;
    b_01[0]._5_1_ = uVar50;
    b_01[0]._6_1_ = uVar51;
    b_01[0]._7_1_ = uVar52;
    b_01[1] = in_stack_ffffffffffffeb80;
    b_01[2] = in_stack_ffffffffffffeb88;
    b_01[3] = in_stack_ffffffffffffeb90;
    avx2_merge1_even(a_01,b_01);
    a_02[1] = in_stack_ffffffffffffeba0;
    a_02[0] = in_stack_ffffffffffffeb98;
    a_02[2] = in_stack_ffffffffffffeba8;
    a_02[3] = in_stack_ffffffffffffebb0;
    b_02[0]._1_1_ = uVar46;
    b_02[0]._0_1_ = uVar45;
    b_02[0]._2_1_ = uVar47;
    b_02[0]._3_1_ = uVar48;
    b_02[0]._4_1_ = uVar49;
    b_02[0]._5_1_ = uVar50;
    b_02[0]._6_1_ = uVar51;
    b_02[0]._7_1_ = uVar52;
    b_02[1] = in_stack_ffffffffffffeb80;
    b_02[2] = in_stack_ffffffffffffeb88;
    b_02[3] = in_stack_ffffffffffffeb90;
    avx2_merge1_odd(a_02,b_02);
    a_03[1] = in_stack_ffffffffffffeba0;
    a_03[0] = in_stack_ffffffffffffeb98;
    a_03[2] = in_stack_ffffffffffffeba8;
    a_03[3] = in_stack_ffffffffffffebb0;
    b_03[0]._1_1_ = uVar46;
    b_03[0]._0_1_ = uVar45;
    b_03[0]._2_1_ = uVar47;
    b_03[0]._3_1_ = uVar48;
    b_03[0]._4_1_ = uVar49;
    b_03[0]._5_1_ = uVar50;
    b_03[0]._6_1_ = uVar51;
    b_03[0]._7_1_ = uVar52;
    b_03[1] = in_stack_ffffffffffffeb80;
    b_03[2] = in_stack_ffffffffffffeb88;
    b_03[3] = in_stack_ffffffffffffeb90;
    uVar29 = uVar27;
    uVar34 = uVar32;
    uVar38 = uVar36;
    uVar43 = uVar41;
    avx2_merge2_even(a_03,b_03);
    a_04[1] = in_stack_ffffffffffffeba0;
    a_04[0] = in_stack_ffffffffffffeb98;
    a_04[2] = in_stack_ffffffffffffeba8;
    a_04[3] = in_stack_ffffffffffffebb0;
    b_04[0]._1_1_ = uVar46;
    b_04[0]._0_1_ = uVar45;
    b_04[0]._2_1_ = uVar47;
    b_04[0]._3_1_ = uVar48;
    b_04[0]._4_1_ = uVar49;
    b_04[0]._5_1_ = uVar50;
    b_04[0]._6_1_ = uVar51;
    b_04[0]._7_1_ = uVar52;
    b_04[1] = in_stack_ffffffffffffeb80;
    b_04[2] = in_stack_ffffffffffffeb88;
    b_04[3] = in_stack_ffffffffffffeb90;
    uVar30 = uVar28;
    uVar35 = uVar33;
    uVar39 = uVar37;
    uVar44 = uVar42;
    avx2_merge2_even(a_04,b_04);
    a_05[1] = in_stack_ffffffffffffeba0;
    a_05[0] = in_stack_ffffffffffffeb98;
    a_05[2] = in_stack_ffffffffffffeba8;
    a_05[3] = in_stack_ffffffffffffebb0;
    b_05[0]._1_1_ = uVar46;
    b_05[0]._0_1_ = uVar45;
    b_05[0]._2_1_ = uVar47;
    b_05[0]._3_1_ = uVar48;
    b_05[0]._4_1_ = uVar49;
    b_05[0]._5_1_ = uVar50;
    b_05[0]._6_1_ = uVar51;
    b_05[0]._7_1_ = uVar52;
    b_05[1] = in_stack_ffffffffffffeb80;
    b_05[2] = in_stack_ffffffffffffeb88;
    b_05[3] = in_stack_ffffffffffffeb90;
    avx2_merge2_odd(a_05,b_05);
    a_06[1] = in_stack_ffffffffffffeba0;
    a_06[0] = in_stack_ffffffffffffeb98;
    a_06[2] = in_stack_ffffffffffffeba8;
    a_06[3] = in_stack_ffffffffffffebb0;
    b_06[0]._1_1_ = uVar46;
    b_06[0]._0_1_ = uVar45;
    b_06[0]._2_1_ = uVar47;
    b_06[0]._3_1_ = uVar48;
    b_06[0]._4_1_ = uVar49;
    b_06[0]._5_1_ = uVar50;
    b_06[0]._6_1_ = uVar51;
    b_06[0]._7_1_ = uVar52;
    b_06[1] = in_stack_ffffffffffffeb80;
    b_06[2] = in_stack_ffffffffffffeb88;
    b_06[3] = in_stack_ffffffffffffeb90;
    avx2_merge2_odd(a_06,b_06);
    auVar3._8_8_ = uVar34;
    auVar3._0_8_ = uVar29;
    auVar3._16_8_ = uVar38;
    auVar3._24_8_ = uVar43;
    auVar4._16_8_ = uStack_10b0;
    auVar4._0_16_ = auVar31;
    auVar4._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar3,auVar4);
    auVar25._16_8_ = uStack_d0;
    auVar25._0_16_ = auVar1;
    auVar25._24_8_ = uStack_c8;
    auVar3 = vpshufb_avx2(auVar25,auVar2);
    auVar17._8_8_ = uVar34;
    auVar17._0_8_ = uVar29;
    auVar17._16_8_ = uVar38;
    auVar17._24_8_ = uVar43;
    auVar2 = vpsrld_avx2(auVar17,ZEXT416(4));
    auVar6._16_8_ = uStack_10b0;
    auVar6._0_16_ = auVar31;
    auVar6._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar2,auVar6);
    auVar24._16_8_ = uStack_d0;
    auVar24._0_16_ = auVar1;
    auVar24._24_8_ = uStack_c8;
    auVar4 = vpshufb_avx2(auVar24,auVar2);
    auVar5._8_8_ = uVar35;
    auVar5._0_8_ = uVar30;
    auVar5._16_8_ = uVar39;
    auVar5._24_8_ = uVar44;
    auVar8._16_8_ = uStack_10b0;
    auVar8._0_16_ = auVar31;
    auVar8._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar5,auVar8);
    auVar23._16_8_ = uStack_d0;
    auVar23._0_16_ = auVar1;
    auVar23._24_8_ = uStack_c8;
    auVar5 = vpshufb_avx2(auVar23,auVar2);
    auVar16._8_8_ = uVar35;
    auVar16._0_8_ = uVar30;
    auVar16._16_8_ = uVar39;
    auVar16._24_8_ = uVar44;
    auVar2 = vpsrld_avx2(auVar16,ZEXT416(4));
    auVar9._16_8_ = uStack_10b0;
    auVar9._0_16_ = auVar31;
    auVar9._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar2,auVar9);
    auVar22._16_8_ = uStack_d0;
    auVar22._0_16_ = auVar1;
    auVar22._24_8_ = uStack_c8;
    auVar6 = vpshufb_avx2(auVar22,auVar2);
    auVar7._8_8_ = uVar32;
    auVar7._0_8_ = uVar27;
    auVar7._16_8_ = uVar36;
    auVar7._24_8_ = uVar41;
    auVar10._16_8_ = uStack_10b0;
    auVar10._0_16_ = auVar31;
    auVar10._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar7,auVar10);
    auVar21._16_8_ = uStack_d0;
    auVar21._0_16_ = auVar1;
    auVar21._24_8_ = uStack_c8;
    auVar7 = vpshufb_avx2(auVar21,auVar2);
    auVar15._8_8_ = uVar32;
    auVar15._0_8_ = uVar27;
    auVar15._16_8_ = uVar36;
    auVar15._24_8_ = uVar41;
    auVar2 = vpsrld_avx2(auVar15,ZEXT416(4));
    auVar11._16_8_ = uStack_10b0;
    auVar11._0_16_ = auVar31;
    auVar11._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar2,auVar11);
    auVar20._16_8_ = uStack_d0;
    auVar20._0_16_ = auVar1;
    auVar20._24_8_ = uStack_c8;
    auVar8 = vpshufb_avx2(auVar20,auVar2);
    auVar2._8_8_ = uVar33;
    auVar2._0_8_ = uVar28;
    auVar2._16_8_ = uVar37;
    auVar2._24_8_ = uVar42;
    auVar12._16_8_ = uStack_10b0;
    auVar12._0_16_ = auVar31;
    auVar12._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar2,auVar12);
    auVar19._16_8_ = uStack_d0;
    auVar19._0_16_ = auVar1;
    auVar19._24_8_ = uStack_c8;
    auVar9 = vpshufb_avx2(auVar19,auVar2);
    in_stack_ffffffffffffeba0 = auVar9._0_8_;
    in_stack_ffffffffffffeba8 = auVar9._8_8_;
    in_stack_ffffffffffffebb0 = auVar9._16_8_;
    auVar14._8_8_ = uVar33;
    auVar14._0_8_ = uVar28;
    auVar14._16_8_ = uVar37;
    auVar14._24_8_ = uVar42;
    auVar2 = vpsrld_avx2(auVar14,ZEXT416(4));
    auVar13._16_8_ = uStack_10b0;
    auVar13._0_16_ = auVar31;
    auVar13._24_8_ = uStack_10a8;
    auVar2 = vpand_avx2(auVar2,auVar13);
    auVar18._16_8_ = uStack_d0;
    auVar18._0_16_ = auVar1;
    auVar18._24_8_ = uStack_c8;
    auVar2 = vpshufb_avx2(auVar18,auVar2);
    in_stack_ffffffffffffeb80 = auVar2._0_8_;
    in_stack_ffffffffffffeb88 = auVar2._8_8_;
    in_stack_ffffffffffffeb90 = auVar2._16_8_;
    in_stack_ffffffffffffeb98 = auVar2._24_8_;
    local_1100 = vpaddb_avx2(local_1100,auVar3);
    local_1120 = vpaddb_avx2(local_1120,auVar5);
    local_1140 = vpaddb_avx2(local_1140,auVar7);
    local_1160 = vpaddb_avx2(local_1160,auVar9);
    local_1180 = vpaddb_avx2(local_1180,auVar4);
    local_11a0 = vpaddb_avx2(local_11a0,auVar6);
    local_11c0 = vpaddb_avx2(local_11c0,auVar8);
    local_11e0 = vpaddb_avx2(local_11e0,auVar2);
    local_10c4 = local_10c4 + 1;
    if (local_10c4 == 0x3f) {
      auVar2 = vpsadbw_avx2(local_1100,ZEXT1632(ZEXT816(0)));
      local_fa0 = vpaddq_avx2(local_fa0,auVar2);
      in_stack_ffffffffffffeb40 = 0;
      in_stack_ffffffffffffeb48 = 0;
      in_stack_ffffffffffffeb50 = 0;
      local_1100._0_16_ = ZEXT816(0);
      local_1100 = ZEXT1632(local_1100._0_16_);
      auVar2 = vpsadbw_avx2(local_1120,ZEXT1632(ZEXT816(0)));
      local_fc0 = vpaddq_avx2(local_fc0,auVar2);
      local_1120._0_16_ = ZEXT816(0);
      local_1120 = ZEXT1632(local_1120._0_16_);
      auVar2 = vpsadbw_avx2(local_1140,ZEXT1632(ZEXT816(0)));
      local_fe0 = vpaddq_avx2(local_fe0,auVar2);
      local_1140._0_16_ = ZEXT816(0);
      local_1140 = ZEXT1632(local_1140._0_16_);
      auVar2 = vpsadbw_avx2(local_1160,ZEXT1632(ZEXT816(0)));
      local_1000 = vpaddq_avx2(local_1000,auVar2);
      local_1160._0_16_ = ZEXT816(0);
      local_1160 = ZEXT1632(local_1160._0_16_);
      auVar2 = vpsadbw_avx2(local_1180,ZEXT1632(ZEXT816(0)));
      local_1020 = vpaddq_avx2(local_1020,auVar2);
      local_1180._0_16_ = ZEXT816(0);
      local_1180 = ZEXT1632(local_1180._0_16_);
      auVar2 = vpsadbw_avx2(local_11a0,ZEXT1632(ZEXT816(0)));
      local_1040 = vpaddq_avx2(local_1040,auVar2);
      local_11a0._0_16_ = ZEXT816(0);
      local_11a0 = ZEXT1632(local_11a0._0_16_);
      auVar2 = vpsadbw_avx2(local_11c0,ZEXT1632(ZEXT816(0)));
      local_1060 = vpaddq_avx2(local_1060,auVar2);
      local_11c0._0_16_ = ZEXT816(0);
      local_11c0 = ZEXT1632(local_11c0._0_16_);
      auVar2 = vpsadbw_avx2(local_11e0,ZEXT1632(ZEXT816(0)));
      local_1080 = vpaddq_avx2(local_1080,auVar2);
      local_11e0._0_16_ = ZEXT816(0);
      local_11e0 = ZEXT1632(local_11e0._0_16_);
      local_10c4 = 0;
    }
  }
  if (local_10c4 != 0) {
    auVar2 = vpsadbw_avx2(local_1100,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_fa0,auVar2);
    auVar2 = vpsadbw_avx2(local_1120,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_fc0,auVar2);
    auVar2 = vpsadbw_avx2(local_1140,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_fe0,auVar2);
    auVar2 = vpsadbw_avx2(local_1160,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_1000,auVar2);
    auVar2 = vpsadbw_avx2(local_1180,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_1020,auVar2);
    auVar2 = vpsadbw_avx2(local_11a0,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_1040,auVar2);
    auVar2 = vpsadbw_avx2(local_11c0,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_1060,auVar2);
    auVar2 = vpsadbw_avx2(local_11e0,ZEXT1632(ZEXT816(0)));
    vpaddq_avx2(local_1080,auVar2);
  }
  x[1] = in_stack_ffffffffffffeb40;
  x[0] = 0x15e917;
  x[2] = in_stack_ffffffffffffeb48;
  x[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x);
  *in_RDX = *in_RDX + (int)uVar26;
  x_00[1] = in_stack_ffffffffffffeb40;
  x_00[0] = 0x15e937;
  x_00[2] = in_stack_ffffffffffffeb48;
  x_00[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_00);
  in_RDX[1] = in_RDX[1] + (int)uVar26;
  x_01[1] = in_stack_ffffffffffffeb40;
  x_01[0] = 0x15e959;
  x_01[2] = in_stack_ffffffffffffeb48;
  x_01[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_01);
  in_RDX[2] = in_RDX[2] + (int)uVar26;
  x_02[1] = in_stack_ffffffffffffeb40;
  x_02[0] = 0x15e97b;
  x_02[2] = in_stack_ffffffffffffeb48;
  x_02[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_02);
  in_RDX[3] = in_RDX[3] + (int)uVar26;
  x_03[1] = in_stack_ffffffffffffeb40;
  x_03[0] = 0x15e99d;
  x_03[2] = in_stack_ffffffffffffeb48;
  x_03[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_03);
  in_RDX[4] = in_RDX[4] + (int)uVar26;
  x_04[1] = in_stack_ffffffffffffeb40;
  x_04[0] = 0x15e9bf;
  x_04[2] = in_stack_ffffffffffffeb48;
  x_04[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_04);
  in_RDX[5] = in_RDX[5] + (int)uVar26;
  x_05[1] = in_stack_ffffffffffffeb40;
  x_05[0] = 0x15e9e1;
  x_05[2] = in_stack_ffffffffffffeb48;
  x_05[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_05);
  in_RDX[6] = in_RDX[6] + (int)uVar26;
  x_06[1] = in_stack_ffffffffffffeb40;
  x_06[0] = 0x15ea03;
  x_06[2] = in_stack_ffffffffffffeb48;
  x_06[3] = in_stack_ffffffffffffeb50;
  uVar26 = avx2_sum_epu64(x_06);
  in_RDX[7] = in_RDX[7] + (int)uVar26;
  pospopcnt_u8_scalar_naive(local_f50,in_RSI & 0x7f,in_RDX);
  return;
}

Assistant:

void pospopcnt_u8_avx2_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    const __m256i popcnt_4bit = _mm256_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4,

        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m256i lo_nibble = _mm256_set1_epi8(0x0f);

    int local = 0;
    __m256i counter8bit_a = zero;
    __m256i counter8bit_b = zero;
    __m256i counter8bit_c = zero;
    __m256i counter8bit_d = zero;
    __m256i counter8bit_e = zero;
    __m256i counter8bit_f = zero;
    __m256i counter8bit_g = zero;
    __m256i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*32 - 1)]; data != end; data += 4*32) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m256i s0 = avx2_merge1_even(r0, r1);
        const __m256i s1 = avx2_merge1_odd (r0, r1);
        const __m256i s2 = avx2_merge1_even(r2, r3);
        const __m256i s3 = avx2_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m256i d0 = avx2_merge2_even(s0, s2);
        const __m256i d1 = avx2_merge2_even(s1, s3);
        const __m256i d2 = avx2_merge2_odd (s0, s2);
        const __m256i d3 = avx2_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i popcnt_a = _mm256_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m256i popcnt_e = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d0, 4) & lo_nibble);
        const __m256i popcnt_b = _mm256_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m256i popcnt_f = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d1, 4) & lo_nibble);
        const __m256i popcnt_c = _mm256_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m256i popcnt_g = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d2, 4) & lo_nibble);
        const __m256i popcnt_d = _mm256_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m256i popcnt_h = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm256_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm256_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm256_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm256_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm256_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm256_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm256_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm256_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm256_setzero_si256();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_b);
    flag_counts[2] += avx2_sum_epu64(counter_c);
    flag_counts[3] += avx2_sum_epu64(counter_d);
    flag_counts[4] += avx2_sum_epu64(counter_e);
    flag_counts[5] += avx2_sum_epu64(counter_f);
    flag_counts[6] += avx2_sum_epu64(counter_g);
    flag_counts[7] += avx2_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*32), flag_counts);
}